

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O3

spv_result_t spvtools::val::ValidateDecorations(ValidationState_t *vstate)

{
  _Tuple_impl<0UL,_spv::Decoration,_unsigned_int> *p_Var1;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *this;
  CapabilitySet *this_00;
  ushort uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  _Rb_tree_color _Var5;
  _Rb_tree_color id;
  float fVar6;
  uint32_t decoration;
  _Head_base<0UL,_spv::Decoration,_false> id_00;
  _Head_base<1UL,_unsigned_int,_false> _Var7;
  pointer pFVar8;
  __node_base _Var9;
  bool bVar10;
  bool bVar11;
  StorageClass SVar12;
  _Rb_tree_color _Var13;
  uint uVar14;
  uint32_t uVar15;
  MatrixLayout MVar16;
  uint32_t uVar17;
  Op OVar18;
  MemoryModel MVar19;
  spv_result_t sVar20;
  uint *puVar21;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *pvVar22;
  __hashtable *p_Var23;
  _Rb_tree_color *p_Var24;
  undefined8 extraout_RAX;
  Instruction *pIVar25;
  _Rb_tree_node_base *p_Var26;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar27;
  ulong uVar28;
  MatrixLayout *pMVar29;
  Instruction *pIVar30;
  __hashtable *p_Var31;
  DiagnosticStream *pDVar32;
  iterator iVar33;
  iterator iVar34;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *pvVar35;
  size_t sVar36;
  mapped_type *pmVar37;
  _Base_ptr p_Var38;
  ostream *poVar39;
  byte bVar40;
  __hashtable *p_Var41;
  _Tuple_impl<0UL,_spv::Decoration,_unsigned_int> _Var42;
  ValidationState_t *pVVar43;
  Decoration decoration_00;
  int iVar44;
  ValidationState_t *pVVar45;
  ulong extraout_RDX;
  Instruction *unaff_RBX;
  pointer puVar46;
  void *pvVar47;
  long lVar48;
  pointer pIVar49;
  __hashtable *p_Var50;
  pointer pIVar51;
  _Hash_node_base *p_Var52;
  char *pcVar53;
  __hashtable *p_Var54;
  uint uVar55;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  pos;
  _Base_ptr p_Var56;
  anon_unknown_0 *this_01;
  pointer this_02;
  _Rb_tree_header *p_Var57;
  char cVar58;
  bool bVar59;
  bool bVar60;
  pair<std::__detail::_Node_iterator<spvtools::val::Instruction_*,_true,_false>,_bool> pVar61;
  pair<std::__detail::_Node_iterator<spv::BuiltIn,_true,_false>,_bool> pVar62;
  pair<std::_Rb_tree_iterator<std::tuple<spv::Decoration,_unsigned_int>_>,_bool> pVar63;
  pair<std::_Rb_tree_iterator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_bool>
  pVar64;
  Instruction *local_5b0;
  string linkage_name;
  undefined4 local_574;
  Instruction *var_instr;
  Instruction *local_560;
  undefined8 local_558;
  ulong local_550;
  uint local_544;
  unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
  output_var_builtin;
  __hashtable *__h_1;
  PerIDKey k;
  undefined1 auStack_4f0 [16];
  code *local_4e0;
  undefined4 local_4d8;
  uint local_4cc;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *local_4c8;
  uint local_4bc;
  __hashtable *local_4b8;
  unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
  input_var_builtin;
  BuiltIn builtin;
  _Head_base<0UL,_spv::Decoration,_false> _Stack_474;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_470;
  undefined4 local_458;
  uint ep_id;
  undefined4 uStack_444;
  pointer puStack_440;
  pointer local_438;
  __hashtable *__h;
  ulong local_420;
  __hashtable *__h_3;
  __hashtable *__h_2;
  __hashtable *local_408;
  AssemblyGrammar *local_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *local_3e0;
  undefined1 local_3d0 [8];
  undefined1 local_3c8 [24];
  undefined4 local_3b0;
  spv_result_t local_200;
  uint *local_1f8;
  uint *local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  unordered_set<spvtools::val::Instruction_*,_std::hash<spvtools::val::Instruction_*>,_std::equal_to<spvtools::val::Instruction_*>,_std::allocator<spvtools::val::Instruction_*>_>
  seen_vars;
  ios_base local_138 [264];
  
  local_5b0 = unaff_RBX;
  for (p_Var52 = (vstate->global_vars_)._M_h._M_before_begin._M_nxt;
      p_Var52 != (_Hash_node_base *)0x0; p_Var52 = p_Var52->_M_nxt) {
    uVar17 = *(uint32_t *)&p_Var52[1]._M_nxt;
    local_5b0 = ValidationState_t::FindDef(vstate,uVar17);
    if (((long)(local_5b0->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(local_5b0->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start == 0x14) &&
       (bVar10 = anon_unknown_0::hasImportLinkageAttribute(uVar17,vstate), bVar10)) {
      ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3d0,
                 "A module-scope OpVariable with initialization value cannot be marked with the Import Linkage Type."
                 ,0x62);
      sVar20 = local_200;
      local_5b0 = (Instruction *)(ulong)(uint)local_200;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
      if (sVar20 != SPV_SUCCESS) {
        return sVar20;
      }
      break;
    }
  }
  puVar21 = (vstate->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_1f8 = (vstate->entry_points_).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  decoration_00 = (Decoration)vstate;
  if (puVar21 != local_1f8) {
    this = &vstate->id_decorations_;
    this_00 = &vstate->module_capabilities_;
    local_400 = &vstate->grammar_;
    do {
      local_550 = (ulong)*puVar21;
      local_1f0 = puVar21;
      pvVar22 = ValidationState_t::entry_point_descriptions(vstate,*puVar21);
      p_Var31 = (__hashtable *)
                (pvVar22->
                super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                )._M_impl.super__Vector_impl_data._M_start;
      __h = (__hashtable *)
            (pvVar22->
            super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
            )._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var31 != __h) {
        local_4c8 = (map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                     *)((ulong)local_4c8 & 0xffffffff00000000);
        local_560 = (Instruction *)((ulong)local_560 & 0xffffffff00000000);
        __h_1 = (__hashtable *)0x0;
        local_4cc = 0;
        local_4bc = 0;
        local_544 = 0;
        do {
          seen_vars._M_h._M_buckets = &seen_vars._M_h._M_single_bucket;
          seen_vars._M_h._M_bucket_count = 1;
          seen_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          seen_vars._M_h._M_element_count = 0;
          seen_vars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          seen_vars._M_h._M_rehash_policy._M_next_resize = 0;
          seen_vars._M_h._M_single_bucket = (__node_base_ptr)0x0;
          input_var_builtin._M_h._M_buckets = &input_var_builtin._M_h._M_single_bucket;
          input_var_builtin._M_h._M_bucket_count = 1;
          input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          input_var_builtin._M_h._M_element_count = 0;
          input_var_builtin._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          input_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
          input_var_builtin._M_h._M_single_bucket = (__node_base_ptr)0x0;
          output_var_builtin._M_h._M_buckets = &output_var_builtin._M_h._M_single_bucket;
          output_var_builtin._M_h._M_bucket_count = 1;
          output_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          output_var_builtin._M_h._M_element_count = 0;
          output_var_builtin._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          output_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
          output_var_builtin._M_h._M_single_bucket = (__node_base_ptr)0x0;
          p_Var23 = (__hashtable *)
                    (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &p_Var31->_M_rehash_policy)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          __h_3 = (__hashtable *)
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &p_Var31->_M_rehash_policy)->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
          local_4b8 = p_Var31;
          if (p_Var23 != __h_3) {
            do {
              _Var5 = ((_Rb_tree_node_base *)&p_Var23->_M_buckets)->_M_color;
              local_408 = p_Var23;
              var_instr = ValidationState_t::FindDef(vstate,_Var5);
              if (var_instr == (Instruction *)0x0) {
LAB_0061b6e8:
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0,
                           "Interfaces passed to OpEntryPoint must be variables. Found Op",0x3d);
                linkage_name._M_dataplus._M_p = spvOpcodeString((uint)(var_instr->inst_).opcode);
                pDVar32 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)local_3d0,(char **)&linkage_name);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar32,".",1);
                sVar20 = pDVar32->error_;
LAB_0061bc88:
                pIVar25 = (Instruction *)(ulong)(uint)sVar20;
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
LAB_0061bc8d:
                bVar10 = false;
                local_5b0 = pIVar25;
                goto LAB_0061bc96;
              }
              uVar2 = (var_instr->inst_).opcode;
              pVVar43 = (ValidationState_t *)(ulong)uVar2;
              if ((uVar2 != 0x3b) && (uVar2 != 0x1142)) goto LAB_0061b6e8;
              SVar12 = Instruction::GetOperandAs<spv::StorageClass>(var_instr,2);
              uVar14 = vstate->version_;
              if (SVar12 != StorageClassTaskPayloadWorkgroupEXT || uVar14 < 0x10400) {
                if (uVar14 < 0x10400) {
                  if ((SVar12 & ~StorageClassUniform) == Input) goto LAB_0061ac6d;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,
                             "OpEntryPoint interfaces must be OpVariables with Storage Class of Input(1) or Output(3). Found Storage Class "
                             ,0x6d);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0," for Entry Point id ",0x14);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                  lVar48 = 1;
                  pcVar53 = ".";
                }
                else {
                  if (SVar12 != Function) goto LAB_0061ac32;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                  lVar48 = 0x39;
                  pcVar53 = "OpEntryPoint interfaces should only list global variables";
                }
                goto LAB_0061bf1c;
              }
              uVar55 = local_544 & 1;
              local_544 = (uint)CONCAT71((uint7)(uint3)(uVar14 >> 8),1);
              if (uVar55 != 0) {
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0,
                           "There can be at most one OpVariable with storage class TaskPayloadWorkgroupEXT associated with an OpEntryPoint"
                           ,0x6e);
                pIVar25 = (Instruction *)(ulong)(uint)local_200;
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
                local_544 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                goto LAB_0061bc8d;
              }
LAB_0061ac32:
              local_3d0 = (undefined1  [8])&seen_vars;
              pVar61 = std::
                       _Hashtable<spvtools::val::Instruction*,spvtools::val::Instruction*,std::allocator<spvtools::val::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::val::Instruction*>,std::hash<spvtools::val::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       ::
                       _M_insert<spvtools::val::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::val::Instruction*,false>>>>
                                 ((_Hashtable<spvtools::val::Instruction*,spvtools::val::Instruction*,std::allocator<spvtools::val::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::val::Instruction*>,std::hash<spvtools::val::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                   *)local_3d0,&var_instr,local_3d0);
              if (((undefined1  [16])pVar61 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0,"Non-unique OpEntryPoint interface ",0x22);
                ValidationState_t::getIdName_abi_cxx11_(&linkage_name,vstate,_Var5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                           linkage_name._M_string_length);
                lVar48 = 0xe;
                pcVar53 = " is disallowed";
LAB_0061bc53:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0,pcVar53,lVar48);
                sVar20 = local_200;
LAB_0061bc5f:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                  operator_delete(linkage_name._M_dataplus._M_p,
                                  CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                           linkage_name.field_2._M_local_buf[0]) + 1);
                }
                goto LAB_0061bc88;
              }
LAB_0061ac6d:
              puVar46 = (var_instr->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (uVar2 == 0x1142) {
                p_Var24 = puVar46 + 4;
              }
              else {
                pIVar25 = ValidationState_t::FindDef(vstate,puVar46[1]);
                p_Var24 = (pIVar25->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start + 3;
              }
              id = *p_Var24;
              pIVar30 = ValidationState_t::FindDef(vstate,id);
              _Var13 = _Var5;
              if (pIVar30 == (Instruction *)0x0) {
                local_558 = (pointer)((ulong)local_558._4_4_ << 0x20);
              }
              else {
                bVar10 = (pIVar30->inst_).opcode == 0x1e;
                local_558 = (pointer)CONCAT44(local_558._4_4_,
                                              (int)CONCAT71((int7)((ulong)pIVar30 >> 8),bVar10));
                if (bVar10) {
                  _Var13 = id;
                }
              }
              local_3d0._0_4_ = _Var13;
              pmVar37 = std::
                        map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                        ::operator[](this,(key_type_conflict *)local_3d0);
              p_Var38 = (pmVar37->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var57 = &(pmVar37->_M_t)._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)p_Var38 == p_Var57) {
LAB_0061ae31:
                iVar44 = (int)local_560;
              }
              else {
                bVar10 = false;
                do {
                  if (p_Var38[1]._M_color == 0xb) {
                    bVar11 = spvIsVulkanEnv(vstate->context_->target_env);
                    bVar10 = true;
                    if (bVar11) {
                      if (p_Var38[1]._M_color != 0xb) {
                        __assert_fail("dec_type_ == spv::Decoration::BuiltIn",
                                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/decoration.h"
                                      ,0x4f,
                                      "spv::BuiltIn spvtools::val::Decoration::builtin() const");
                      }
                      builtin = (p_Var38[1]._M_parent)->_M_color;
                      if (SVar12 == Output) {
                        local_3d0 = (undefined1  [8])&output_var_builtin;
                        pVar62 = std::
                                 _Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                 ::
                                 _M_insert<spv::BuiltIn_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spv::BuiltIn,false>>>>
                                           ((_Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                             *)local_3d0,&builtin,local_3d0);
                        if (((undefined1  [16])pVar62 & (undefined1  [16])0x1) ==
                            (undefined1  [16])0x0) {
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,
                                     var_instr);
                          ValidationState_t::VkErrorID_abi_cxx11_
                                    (&linkage_name,vstate,0x25bb,(char *)0x0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                                     linkage_name._M_string_length);
                          lVar48 = 0x36;
                          pcVar53 = "OpEntryPoint contains duplicate output variables with ";
LAB_0061b80a:
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3d0,pcVar53,lVar48);
                          k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                          super__Tuple_impl<1UL,_unsigned_int>.
                          super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<1UL,_unsigned_int,_false>)0x0;
                          k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                          super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                               DecorationRelaxedPrecision;
                          sVar20 = AssemblyGrammar::lookupOperand
                                             (local_400,SPV_OPERAND_TYPE_BUILT_IN,builtin,
                                              (spv_operand_desc *)&k);
                          _Var42 = (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)
                                   ((long)"Value Unknown" + 6);
                          if (k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> !=
                              (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)0x0 &&
                              sVar20 == SPV_SUCCESS) {
                            _Var42 = *k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>;
                          }
                          k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> = _Var42;
                          pDVar32 = DiagnosticStream::operator<<
                                              ((DiagnosticStream *)local_3d0,(char **)&k);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar32," builtin",8);
                          sVar20 = pDVar32->error_;
                          goto LAB_0061bc5f;
                        }
                      }
                      else if (SVar12 == Input) {
                        local_3d0 = (undefined1  [8])&input_var_builtin;
                        pVar62 = std::
                                 _Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                 ::
                                 _M_insert<spv::BuiltIn_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spv::BuiltIn,false>>>>
                                           ((_Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                             *)local_3d0,&builtin,local_3d0);
                        if (((undefined1  [16])pVar62 & (undefined1  [16])0x1) ==
                            (undefined1  [16])0x0) {
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,
                                     var_instr);
                          ValidationState_t::VkErrorID_abi_cxx11_
                                    (&linkage_name,vstate,0x25ba,(char *)0x0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                                     linkage_name._M_string_length);
                          lVar48 = 0x35;
                          pcVar53 = "OpEntryPoint contains duplicate input variables with ";
                          goto LAB_0061b80a;
                        }
                      }
                    }
                  }
                  p_Var38 = (_Base_ptr)std::_Rb_tree_increment(p_Var38);
                } while ((_Rb_tree_header *)p_Var38 != p_Var57);
                if (!bVar10) goto LAB_0061ae31;
                local_3d0._0_4_ = _Var5;
                pmVar37 = std::
                          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                          ::operator[](this,(key_type_conflict *)local_3d0);
                for (p_Var26 = (pmVar37->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    (_Rb_tree_header *)p_Var26 != &(pmVar37->_M_t)._M_impl.super__Rb_tree_header;
                    p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26)) {
                  bVar10 = spvIsVulkanEnv(vstate->context_->target_env);
                  if ((bVar10) && ((p_Var26[1]._M_color & ~_S_black) == 0x1e)) {
                    pIVar25 = ValidationState_t::FindDef(vstate,_Var5);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
                    pVVar43 = (ValidationState_t *)0x0;
                    ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1333,(char *)0x0)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                               linkage_name._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,"A BuiltIn variable (id ",0x17);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,
                               ") cannot have any Location or Component decorations",0x33);
                    sVar20 = local_200;
                    pIVar25 = (Instruction *)(ulong)(uint)local_200;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                      operator_delete(linkage_name._M_dataplus._M_p,
                                      CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                               linkage_name.field_2._M_local_buf[0]) + 1);
                    }
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
                    if (sVar20 != SPV_SUCCESS) goto LAB_0061bc8d;
                    break;
                  }
                }
                if ((char)local_558 == '\0') goto LAB_0061ae31;
                local_3d0._0_4_ = id;
                pmVar37 = std::
                          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                          ::operator[](this,(key_type_conflict *)local_3d0);
                p_Var38 = (pmVar37->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                p_Var57 = &(pmVar37->_M_t)._M_impl.super__Rb_tree_header;
                if ((_Rb_tree_header *)p_Var38 != p_Var57) {
                  while (p_Var38[1]._M_color != 2) {
                    p_Var38 = (_Base_ptr)std::_Rb_tree_increment(p_Var38);
                    if ((_Rb_tree_header *)p_Var38 == p_Var57) goto LAB_0061b89f;
                  }
                }
                if ((_Rb_tree_header *)p_Var38 == p_Var57) {
LAB_0061b89f:
                  pIVar25 = ValidationState_t::FindDef(vstate,id);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_DATA,pIVar25);
                  ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1337,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                             linkage_name._M_string_length);
                  lVar48 = 0xc3;
                  pcVar53 = 
                  "Interface struct has no Block decoration but has BuiltIn members. Location decorations must be used on each member of OpVariable with a structure type that is a block not decorated with Location."
                  ;
                  goto LAB_0061bc53;
                }
                uVar14 = (int)local_4c8 + (uint)(SVar12 == Input);
                pVVar43 = (ValidationState_t *)(ulong)uVar14;
                iVar44 = (int)local_560 + (uint)(SVar12 == Output);
                local_4c8 = (map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                             *)CONCAT44(local_4c8._4_4_,uVar14);
                if ((1 < (int)uVar14) || (1 < iVar44)) {
                  local_560 = (Instruction *)CONCAT44(local_560._4_4_,iVar44);
                  break;
                }
              }
              local_560 = (Instruction *)CONCAT44(local_560._4_4_,iVar44);
              if (SVar12 == StorageClassWorkgroup) {
                __h_1 = (__hashtable *)(ulong)((uint)__h_1 + 1);
                if (pIVar30 != (Instruction *)0x0) {
                  if ((pIVar30->inst_).opcode == 0x1e) {
                    bVar10 = anon_unknown_0::hasDecoration
                                       ((anon_unknown_0 *)(ulong)id,2,decoration_00,pVVar43);
                    if (bVar10) {
                      local_4cc = local_4cc + 1;
                    }
                    else if ((uVar2 == 0x1142) &&
                            (bVar10 = EnumSet<spv::Capability>::contains(this_00,CapabilityShader),
                            bVar10)) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr
                                );
                      lVar48 = 0x3e;
                      pcVar53 = "Untyped workgroup variables in shaders must be block decorated";
                      goto LAB_0061bf1c;
                    }
                    bVar10 = anon_unknown_0::hasDecoration
                                       ((anon_unknown_0 *)(ulong)(var_instr->inst_).result_id,0x14,
                                        decoration_00,pVVar43);
                    local_4bc = local_4bc + bVar10;
                  }
                  else if ((uVar2 == 0x1142) &&
                          (bVar10 = EnumSet<spv::Capability>::contains(this_00,CapabilityShader),
                          bVar10)) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                    lVar48 = 0x46;
                    pcVar53 = 
                    "Untyped workgroup variables in shaders must be block decorated structs";
LAB_0061bf1c:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,pcVar53,lVar48);
                    pIVar25 = (Instruction *)(ulong)(uint)local_200;
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
                    goto LAB_0061bc8d;
                  }
                }
              }
              bVar10 = spvIsVulkanEnv(vstate->context_->target_env);
              if (bVar10) {
                local_558 = (pointer)ValidationState_t::GetExecutionModels
                                               (vstate,(uint32_t)local_550);
                p_Var31 = (__hashtable *)
                          (((set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                             *)local_558)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                __h_2 = (__hashtable *)
                        &(((set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                            *)local_558)->_M_t)._M_impl.super__Rb_tree_header;
                local_420 = CONCAT44(local_420._4_4_,id);
                p_Var41 = __h_2;
                p_Var23 = p_Var31;
                p_Var50 = __h_2;
                if (p_Var31 == (__hashtable *)0x0) {
                  local_574 = 0;
                }
                else {
                  do {
                    bVar10 = (uint)(p_Var23->_M_rehash_policy)._M_max_load_factor < 4;
                    if (!bVar10) {
                      p_Var41 = p_Var23;
                    }
                    p_Var23 = (__hashtable *)(&p_Var23->_M_before_begin)[bVar10]._M_nxt;
                  } while (p_Var23 != (__hashtable *)0x0);
                  p_Var23 = __h_2;
                  if ((p_Var41 != __h_2) &&
                     (p_Var23 = p_Var41, 4 < (uint)(p_Var41->_M_rehash_policy)._M_max_load_factor))
                  {
                    p_Var41 = __h_2;
                    p_Var23 = __h_2;
                  }
                  do {
                    p_Var54 = p_Var31;
                    p_Var31 = (__hashtable *)(p_Var54->_M_before_begin)._M_nxt;
                  } while (p_Var31 != (__hashtable *)0x0);
                  pVVar43 = (ValidationState_t *)
                            CONCAT71((int7)((ulong)p_Var41 >> 8),p_Var23 != __h_2);
                  local_574 = SUB84(pVVar43,0);
                  if ((p_Var54 != __h_2) &&
                     (p_Var50 = p_Var54, (p_Var54->_M_rehash_policy)._M_max_load_factor != 0.0)) {
                    p_Var50 = __h_2;
                  }
                }
                local_3d0._0_4_ = (var_instr->inst_).result_id;
                pmVar37 = std::
                          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                          ::operator[](this,(key_type_conflict *)local_3d0);
                for (p_Var26 = (pmVar37->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    (_Rb_tree_header *)p_Var26 != &(pmVar37->_M_t)._M_impl.super__Rb_tree_header;
                    p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26)) {
                  local_3f8._M_unused._M_object = (void *)0x0;
                  local_3f8._8_8_ = 0;
                  local_3e8 = (code *)0x0;
                  local_3d0._0_4_ = 0xe;
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3c8,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3f8);
                  puVar46 = (pointer)local_3c8._0_8_;
                  local_3b0 = 0xffffffff;
                  if (p_Var26[1]._M_color == local_3d0._0_4_) {
                    p_Var38 = p_Var26[1]._M_parent;
                    pVVar45 = (ValidationState_t *)((long)p_Var26[1]._M_left - (long)p_Var38);
                    pVVar43 = (ValidationState_t *)(local_3c8._8_8_ - local_3c8._0_8_);
                    if ((pVVar45 != pVVar43) ||
                       (((p_Var26[1]._M_left != p_Var38 &&
                         (iVar44 = bcmp(p_Var38,(void *)local_3c8._0_8_,(size_t)pVVar45),
                         iVar44 != 0)) || (p_Var26[2]._M_color != ~_S_red)))) goto LAB_0061b046;
                    bVar10 = true;
                  }
                  else {
LAB_0061b046:
                    _ep_id = (pointer)0x0;
                    puStack_440 = (pointer)0x0;
                    local_438 = (pointer)0x0;
                    linkage_name._M_dataplus._M_p._0_4_ = 0xd;
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &linkage_name._M_string_length,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ep_id);
                    pvVar47 = (void *)linkage_name._M_string_length;
                    if (p_Var26[1]._M_color == (_Rb_tree_color)linkage_name._M_dataplus._M_p) {
                      p_Var38 = p_Var26[1]._M_parent;
                      pVVar45 = (ValidationState_t *)((long)p_Var26[1]._M_left - (long)p_Var38);
                      pVVar43 = (ValidationState_t *)
                                (CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                          linkage_name.field_2._M_local_buf[0]) -
                                linkage_name._M_string_length);
                      if (((pVVar45 != pVVar43) ||
                          ((p_Var26[1]._M_left != p_Var38 &&
                           (iVar44 = bcmp(p_Var38,(void *)linkage_name._M_string_length,
                                          (size_t)pVVar45), iVar44 != 0)))) ||
                         (p_Var26[2]._M_color != ~_S_red)) goto LAB_0061b0c5;
                      bVar10 = true;
                    }
                    else {
LAB_0061b0c5:
                      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                      super__Tuple_impl<1UL,_unsigned_int>.
                      super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<1UL,_unsigned_int,_false>)0x11;
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_4f0,
                                 &local_1c8);
                      puVar46 = (pointer)auStack_4f0._0_8_;
                      local_4d8 = 0xffffffff;
                      if ((_Head_base<1UL,_unsigned_int,_false>)p_Var26[1]._M_color ==
                          k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                          super__Tuple_impl<1UL,_unsigned_int>.
                          super__Head_base<1UL,_unsigned_int,_false>._M_head_impl) {
                        p_Var38 = p_Var26[1]._M_parent;
                        pVVar45 = (ValidationState_t *)((long)p_Var26[1]._M_left - (long)p_Var38);
                        pVVar43 = (ValidationState_t *)(auStack_4f0._8_8_ - auStack_4f0._0_8_);
                        if (((pVVar45 != pVVar43) ||
                            ((p_Var26[1]._M_left != p_Var38 &&
                             (iVar44 = bcmp(p_Var38,(void *)auStack_4f0._0_8_,(size_t)pVVar45),
                             iVar44 != 0)))) || (p_Var26[2]._M_color != ~_S_red)) goto LAB_0061b156;
                        bVar10 = true;
                      }
                      else {
LAB_0061b156:
                        local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        builtin = 0x10;
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                  (&vStack_470,&local_1e8);
                        puVar46 = vStack_470.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        local_458 = 0xffffffff;
                        if (p_Var26[1]._M_color == builtin) {
                          p_Var38 = p_Var26[1]._M_parent;
                          pVVar45 = (ValidationState_t *)((long)p_Var26[1]._M_left - (long)p_Var38);
                          pVVar43 = (ValidationState_t *)
                                    ((long)vStack_470.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish +
                                    -(long)vStack_470.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                          if ((pVVar45 != pVVar43) ||
                             ((p_Var26[1]._M_left != p_Var38 &&
                              (iVar44 = bcmp(p_Var38,vStack_470.
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                             (size_t)pVVar45), iVar44 != 0)))) goto LAB_0061b1e4;
                          bVar10 = p_Var26[2]._M_color == ~_S_red;
                        }
                        else {
LAB_0061b1e4:
                          bVar10 = false;
                        }
                        if (puVar46 != (pointer)0x0) {
                          operator_delete(puVar46,(long)vStack_470.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)puVar46);
                        }
                        puVar46 = (pointer)auStack_4f0._0_8_;
                        if (local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_1e8.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_1e8.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_1e8.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                          puVar46 = (pointer)auStack_4f0._0_8_;
                        }
                      }
                      if (puVar46 != (pointer)0x0) {
                        operator_delete(puVar46,(long)local_4e0 - (long)puVar46);
                      }
                      pvVar47 = (void *)linkage_name._M_string_length;
                      if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_1c8.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_1c8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_1c8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                        pvVar47 = (void *)linkage_name._M_string_length;
                      }
                    }
                    if (pvVar47 != (void *)0x0) {
                      operator_delete(pvVar47,linkage_name.field_2._8_8_ - (long)pvVar47);
                    }
                    puVar46 = (pointer)local_3c8._0_8_;
                    if (_ep_id != (pointer)0x0) {
                      operator_delete(_ep_id,(long)local_438 - (long)_ep_id);
                      puVar46 = (pointer)local_3c8._0_8_;
                    }
                  }
                  if (puVar46 != (pointer)0x0) {
                    operator_delete(puVar46,local_3c8._16_8_ - (long)puVar46);
                  }
                  if (local_3f8._M_unused._M_object != (void *)0x0) {
                    operator_delete(local_3f8._M_unused._M_object,(long)local_3e8 - local_3f8._0_8_)
                    ;
                  }
                  if (bVar10) {
                    if (SVar12 == Output) {
                      bVar40 = ~(byte)local_574;
                      pVVar43 = (ValidationState_t *)
                                (ulong)CONCAT31((int3)((uint)local_574 >> 8),bVar40);
                      if ((bVar40 & (((set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                                       *)local_558)->_M_t)._M_impl.super__Rb_tree_header.
                                    _M_node_count < 2) == 0) {
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,
                                   var_instr);
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&linkage_name,vstate,0x1839,(char *)0x0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                                   linkage_name._M_string_length);
                        ValidationState_t::SpvDecorationString_abi_cxx11_
                                  ((string *)&k,vstate,p_Var26[1]._M_color);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3d0,
                                   (char *)k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>,
                                   auStack_4f0._0_8_);
                        lVar48 = 0x6f;
                        pcVar53 = 
                        " decorated variable must not be used in fragment execution model as an Output storage class for Entry Point id "
                        ;
                        goto LAB_0061bb63;
                      }
                    }
                    else if ((SVar12 == Input) &&
                            ((p_Var50 != __h_2 ||
                             (1 < (((set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                                     *)local_558)->_M_t)._M_impl.super__Rb_tree_header._M_node_count
                             )))) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr
                                );
                      ValidationState_t::VkErrorID_abi_cxx11_
                                (&linkage_name,vstate,0x183a,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                                 linkage_name._M_string_length);
                      ValidationState_t::SpvDecorationString_abi_cxx11_
                                ((string *)&k,vstate,p_Var26[1]._M_color);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,
                                 (char *)k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>,
                                 auStack_4f0._0_8_);
                      lVar48 = 0x6c;
                      pcVar53 = 
                      " decorated variable must not be used in vertex execution model as an Input storage class for Entry Point id "
                      ;
LAB_0061bb63:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,pcVar53,lVar48);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,".",1)
                      ;
                      local_5b0 = (Instruction *)(ulong)(uint)local_200;
                      if (k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> !=
                          (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)((long)auStack_4f0 + 8))
                      {
                        operator_delete((void *)k.
                                                super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>
                                        ,(ulong)(auStack_4f0._8_8_ + 1));
                      }
                      goto LAB_0061bbba;
                    }
                  }
                }
                bVar10 = anon_unknown_0::hasDecoration
                                   ((anon_unknown_0 *)(ulong)(var_instr->inst_).result_id,0xe,
                                    decoration_00,pVVar43);
                uVar17 = (uint32_t)local_420;
                if (((!bVar10) && ((SVar12 == Input & (byte)local_574) != 0)) &&
                   (((bVar10 = ValidationState_t::IsFloatScalarType(vstate,(uint32_t)local_420),
                     bVar10 && (uVar15 = ValidationState_t::GetBitWidth(vstate,uVar17),
                               uVar15 == 0x40)) ||
                    (bVar10 = ValidationState_t::IsIntScalarOrVectorType(vstate,uVar17), bVar10))))
                {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                  ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1288,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                             linkage_name._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,"Fragment OpEntryPoint operand ",0x1e);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,
                             " with Input interfaces with integer or float type must have a Flat decoration for Entry Point id "
                             ,0x61);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,".",1);
                  local_5b0 = (Instruction *)(ulong)(uint)local_200;
LAB_0061bbba:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                    operator_delete(linkage_name._M_dataplus._M_p,
                                    CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                             linkage_name.field_2._M_local_buf[0]) + 1);
                  }
                  goto LAB_0061bbe3;
                }
              }
              p_Var23 = (__hashtable *)&((_Rb_tree_node_base *)&local_408->_M_buckets)->field_0x4;
            } while (p_Var23 != __h_3);
          }
          if (((int)local_4c8 < 2) && ((int)local_560 < 2)) {
            local_3d0._0_4_ = (MatrixLayout)local_550;
            pmVar37 = std::
                      map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                      ::operator[](this,(key_type_conflict *)local_3d0);
            for (p_Var38 = (pmVar37->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var38 != &(pmVar37->_M_t)._M_impl.super__Rb_tree_header;
                p_Var38 = (_Base_ptr)std::_Rb_tree_increment(p_Var38)) {
              if (p_Var38[1]._M_color == 0x29) {
                p_Var56 = p_Var38[1]._M_parent;
                p_Var38 = p_Var38[1]._M_left;
                linkage_name._M_dataplus._M_p = (pointer)&linkage_name.field_2;
                linkage_name._M_string_length = 0;
                linkage_name.field_2._M_local_buf[0] = '\0';
                do {
                  if (p_Var56 == p_Var38) {
                    __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/string_utils.h"
                                  ,0x65,
                                  "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = __gnu_cxx::__normal_iterator<const unsigned int *, std::vector<unsigned int>>]"
                                 );
                  }
                  _Var5 = p_Var56->_M_color;
                  lVar48 = 0;
                  do {
                    if ((char)(_Var5 >> ((byte)lVar48 & 0x1f)) == '\0') {
                      pIVar25 = ValidationState_t::FindDef(vstate,(uint32_t)local_550);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,
                                 pIVar25);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,
                                 "The LinkageAttributes Decoration (Linkage name: ",0x30);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                                 linkage_name._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,") cannot be applied to function id ",0x23);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,
                                 " because it is targeted by an OpEntryPoint instruction.",0x37);
                      local_5b0 = (Instruction *)(ulong)(uint)local_200;
                      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                        operator_delete(linkage_name._M_dataplus._M_p,
                                        CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                                 linkage_name.field_2._M_local_buf[0]) + 1);
                      }
                      goto LAB_0061bbe8;
                    }
                    std::__cxx11::string::push_back((char)&linkage_name);
                    lVar48 = lVar48 + 8;
                  } while (lVar48 != 0x20);
                  p_Var56 = (_Base_ptr)&p_Var56->field_0x4;
                } while( true );
              }
            }
            bVar10 = EnumSet<spv::Capability>::contains
                               (this_00,CapabilityWorkgroupMemoryExplicitLayoutKHR);
            if (bVar10) {
              bVar11 = EnumSet<spv::Capability>::contains(this_00,CapabilityUntypedPointersKHR);
              uVar14 = local_4cc;
              bVar10 = true;
              if (((!bVar11) && (0 < (int)(uint)__h_1)) && (0 < (int)local_4cc)) {
                if ((uint)__h_1 != local_4cc) {
                  pIVar25 = ValidationState_t::FindDef(vstate,(uint32_t)local_550);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,pIVar25);
                  lVar48 = 0x102;
                  pcVar53 = 
                  "When declaring WorkgroupMemoryExplicitLayoutKHR, either all or none of the Workgroup Storage Class variables in the entry point interface must point to struct types decorated with Block (unless the UntypedPointersKHR capability is declared).  Entry point id "
                  ;
                  goto LAB_0061b5c5;
                }
                if ((1 < local_4cc) && (local_4cc != local_4bc)) {
                  pIVar25 = ValidationState_t::FindDef(vstate,(uint32_t)local_550);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,pIVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,
                             "When declaring WorkgroupMemoryExplicitLayoutKHR, if more than one Workgroup Storage Class variable in the entry point interface point to a type decorated with Block, all of them must be decorated with Aliased (unless the UntypedPointerWorkgroupKHR capability is declared). Entry point id "
                             ,0x120);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0," does not meet this requirement.",0x20);
                  local_5b0 = (Instruction *)(ulong)(uint)local_200;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
                  bVar10 = false;
                }
                __h_1 = (__hashtable *)(ulong)uVar14;
              }
            }
            else {
              if (0 < (int)local_4cc) {
                pIVar25 = ValidationState_t::FindDef(vstate,(uint32_t)local_550);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,pIVar25);
                lVar48 = 0x81;
                pcVar53 = 
                "Workgroup Storage Class variables can\'t be decorated with Block unless declaring the WorkgroupMemoryExplicitLayoutKHR capability."
                ;
                goto LAB_0061b5e4;
              }
              bVar10 = true;
            }
          }
          else {
            pIVar25 = ValidationState_t::FindDef(vstate,(MatrixLayout)local_550);
            ValidationState_t::diag
                      ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,pIVar25);
            lVar48 = 0xa9;
            pcVar53 = 
            "There must be at most one object per Storage Class that can contain a structure type containing members decorated with BuiltIn, consumed per entry-point. Entry Point id "
            ;
LAB_0061b5c5:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,pcVar53,lVar48);
            std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
            lVar48 = 0x20;
            pcVar53 = " does not meet this requirement.";
LAB_0061b5e4:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,pcVar53,lVar48);
            local_5b0 = (Instruction *)(ulong)(uint)local_200;
LAB_0061bbe3:
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
LAB_0061bbe8:
            bVar10 = false;
          }
LAB_0061bc96:
          std::
          _Hashtable<spv::BuiltIn,_spv::BuiltIn,_std::allocator<spv::BuiltIn>,_std::__detail::_Identity,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&output_var_builtin._M_h);
          std::
          _Hashtable<spv::BuiltIn,_spv::BuiltIn,_std::allocator<spv::BuiltIn>,_std::__detail::_Identity,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&input_var_builtin._M_h);
          std::
          _Hashtable<spvtools::val::Instruction_*,_spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::val::Instruction_*>,_std::hash<spvtools::val::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&seen_vars._M_h);
          if (!bVar10) {
            if ((spv_result_t)local_5b0 != SPV_SUCCESS) {
              return (spv_result_t)local_5b0;
            }
            goto LAB_0061bf63;
          }
          p_Var31 = local_4b8 + 1;
        } while (p_Var31 != __h);
      }
      puVar21 = local_1f0 + 1;
    } while (puVar21 != local_1f8);
  }
LAB_0061bf63:
  seen_vars._M_h._M_buckets = &seen_vars._M_h._M_single_bucket;
  seen_vars._M_h._M_bucket_count = 1;
  seen_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen_vars._M_h._M_element_count = 0;
  seen_vars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  seen_vars._M_h._M_rehash_policy._M_next_resize = 0;
  seen_vars._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pIVar51 = (vstate->ordered_instructions_).
            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar49 = (vstate->ordered_instructions_).
            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar51 != pIVar49) {
    local_4b8 = (__hashtable *)&vstate->module_capabilities_;
    local_4c8 = &vstate->id_decorations_;
    __h = &(vstate->pointer_to_uniform_block_)._M_h;
    __h_2 = &(vstate->pointer_to_storage_buffer_)._M_h;
    local_5b0 = (Instruction *)&vstate->struct_for_storage_buffer_;
    __h_3 = (__hashtable *)local_5b0;
    do {
      pIVar25 = ValidationState_t::FindDef(vstate,(pIVar51->inst_).type_id);
      input_var_builtin._M_h._M_buckets = &input_var_builtin._M_h._M_single_bucket;
      input_var_builtin._M_h._M_bucket_count = 1;
      input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      input_var_builtin._M_h._M_element_count = 0;
      input_var_builtin._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      input_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
      input_var_builtin._M_h._M_single_bucket = (__node_base_ptr)0x0;
      uVar3 = (pIVar51->inst_).opcode;
      if ((uVar3 != 0x1142) && (uVar3 != 0x3b)) {
        if ((pIVar25 == (Instruction *)0x0) ||
           (((pIVar25->inst_).opcode != 0x20 ||
            (SVar12 = Instruction::GetOperandAs<spv::StorageClass>(pIVar25,1),
            SVar12 != PhysicalStorageBuffer)))) {
          bVar10 = EnumSet<spv::Capability>::contains
                             ((EnumSet<spv::Capability> *)local_4b8,CapabilityUntypedPointersKHR);
          _Var9 = input_var_builtin._M_h._M_before_begin;
          cVar58 = '\0';
          if ((bVar10) &&
             (bVar10 = spvIsVulkanEnv(vstate->context_->target_env),
             _Var9 = input_var_builtin._M_h._M_before_begin, cVar58 = '\0', bVar10)) {
            uVar2 = (pIVar51->inst_).opcode;
            cVar58 = '\x03';
            uVar14 = uVar2 - 0x1143;
            if (uVar14 < 7) {
              if ((0x33U >> (uVar14 & 0x1f) & 1) == 0) {
                if (uVar14 != 6) goto LAB_0061cefe;
                uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar51,3);
                pIVar25 = ValidationState_t::FindDef(vstate,uVar14);
                uVar17 = (pIVar25->inst_).type_id;
              }
              else {
                uVar17 = (pIVar51->inst_).type_id;
              }
              uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar51,2);
LAB_0061c221:
              _Var9._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
              if ((uVar15 != 0) && (uVar17 != 0)) {
                local_560 = pIVar51;
                pIVar25 = ValidationState_t::FindDef(vstate,uVar17);
                SVar12 = Instruction::GetOperandAs<spv::StorageClass>(pIVar25,1);
                psVar27 = (set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                           *)0x8d9720;
                bVar10 = SVar12 != StorageClassUniform;
                if ((SVar12 == StorageClassUniform) ||
                   (psVar27 = (set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                               *)0x8d95bb, SVar12 == PushConstant)) {
                  local_558 = (pointer)psVar27;
                  pIVar25 = ValidationState_t::FindDef(vstate,uVar15);
                  uVar28 = 0x28;
                }
                else {
                  pIVar25 = ValidationState_t::FindDef(vstate,uVar15);
                  pcVar53 = "ConstantDataStorageBuffer";
                  if (SVar12 == StorageClassWorkgroup) {
                    pcVar53 = "Function or Workgroup";
                  }
                  local_558 = (pointer)(pcVar53 + 0xc);
                  uVar28 = (ulong)(SVar12 == StorageClassWorkgroup) | 0x28;
                }
                bVar11 = *(bool *)((long)&(vstate->options_->universal_limits_).max_struct_members +
                                  uVar28);
                if (((pIVar25->inst_).opcode & 0xfffe) == 0x1c) {
                  uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar25,1);
                  pIVar30 = ValidationState_t::FindDef(vstate,uVar14);
                  if (((pIVar30->inst_).opcode == 0x1e) &&
                     ((bVar59 = ValidationState_t::HasDecoration
                                          (vstate,(pIVar30->inst_).result_id,Block), bVar59 ||
                      (bVar59 = ValidationState_t::HasDecoration
                                          (vstate,(pIVar30->inst_).result_id,BufferBlock), bVar59)))
                     ) {
                    uVar15 = (pIVar30->inst_).result_id;
                    pIVar25 = pIVar30;
                  }
                }
                if ((pIVar25->inst_).opcode == 0x1e) {
                  bVar10 = true;
                  if (SVar12 == StorageClassUniform) {
                    bVar10 = ValidationState_t::HasDecoration(vstate,uVar15,BufferBlock);
                  }
                  local_3d0._0_4_ = kColumnMajor;
                  local_3d0._4_4_ = 0;
                  anon_unknown_0::ComputeMemberConstraintsForStruct
                            ((MemberConstraints *)&input_var_builtin,uVar15,
                             (LayoutConstraints *)local_3d0,vstate);
                }
                pcVar53 = "BufferBlock";
                if (SVar12 != StorageClassUniform) {
                  pcVar53 = "Block";
                }
                if (bVar10 == false) {
                  pcVar53 = "Block";
                }
                sVar20 = anon_unknown_0::checkLayout
                                   (uVar15,(char *)local_558,pcVar53,(bool)(bVar10 ^ 1),bVar11,0,
                                    (MemberConstraints *)&input_var_builtin,vstate);
                cVar58 = sVar20 != SPV_SUCCESS;
                local_5b0 = (Instruction *)((ulong)local_5b0 & 0xffffffff);
                _Var9 = input_var_builtin._M_h._M_before_begin;
                pIVar51 = local_560;
                if ((bool)cVar58) {
                  local_5b0 = (Instruction *)(ulong)(uint)sVar20;
                }
              }
            }
            else {
LAB_0061cefe:
              if (uVar2 == 0x3d) {
                uVar17 = ValidationState_t::GetOperandTypeId(vstate,pIVar51,2);
                OVar18 = ValidationState_t::GetIdOpcode(vstate,uVar17);
                _Var9 = input_var_builtin._M_h._M_before_begin;
                if (OVar18 == OpTypeUntypedPointerKHR) {
                  uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar51,2);
                  pIVar25 = ValidationState_t::FindDef(vstate,uVar14);
                  uVar17 = (pIVar25->inst_).type_id;
                  uVar15 = (pIVar51->inst_).type_id;
                  goto LAB_0061c221;
                }
              }
              else if (uVar2 == 0x3e) {
                uVar17 = ValidationState_t::GetOperandTypeId(vstate,pIVar51,0);
                OVar18 = ValidationState_t::GetIdOpcode(vstate,uVar17);
                _Var9 = input_var_builtin._M_h._M_before_begin;
                if (OVar18 == OpTypeUntypedPointerKHR) {
                  uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar51,0);
                  pIVar25 = ValidationState_t::FindDef(vstate,uVar14);
                  uVar17 = (pIVar25->inst_).type_id;
                  uVar15 = ValidationState_t::GetOperandTypeId(vstate,pIVar51,1);
                  goto LAB_0061c221;
                }
              }
            }
          }
        }
        else {
          uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2);
          pIVar25 = ValidationState_t::FindDef(vstate,uVar14);
          bVar10 = vstate->options_->scalar_block_layout;
          if ((pIVar25->inst_).opcode == 0x1e) {
            local_3d0._0_4_ = kColumnMajor;
            local_3d0._4_4_ = 0;
            anon_unknown_0::ComputeMemberConstraintsForStruct
                      ((MemberConstraints *)&input_var_builtin,uVar14,(LayoutConstraints *)local_3d0
                       ,vstate);
          }
          sVar20 = anon_unknown_0::checkLayout
                             (uVar14,"PhysicalStorageBuffer","Block",false,bVar10,0,
                              (MemberConstraints *)&input_var_builtin,vstate);
          cVar58 = sVar20 != SPV_SUCCESS;
          local_5b0 = (Instruction *)((ulong)local_5b0 & 0xffffffff);
          _Var9 = input_var_builtin._M_h._M_before_begin;
          if ((bool)cVar58) {
            local_5b0 = (Instruction *)(ulong)(uint)sVar20;
          }
        }
        goto joined_r0x0061d334;
      }
      uVar14 = (pIVar51->inst_).result_id;
      this_01 = (anon_unknown_0 *)(ulong)uVar14;
      uVar55 = (pIVar51->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[3];
      pVVar43 = (ValidationState_t *)(ulong)uVar55;
      bVar10 = spvIsVulkanEnv(vstate->context_->target_env);
      if (bVar10) {
        if (uVar55 == 9) {
          ValidationState_t::EntryPointReferences
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &output_var_builtin,vstate,uVar14);
          for (p_Var26 = (_Rb_tree_node_base *)output_var_builtin._M_h._M_element_count;
              p_Var26 != (_Rb_tree_node_base *)&output_var_builtin._M_h._M_bucket_count;
              p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26)) {
            _ep_id = (pointer)CONCAT44(uStack_444,p_Var26[1]._M_color);
            local_3d0 = (undefined1  [8])&seen_vars;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      (local_3d0,
                       (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&ep_id,local_3d0);
            if ((extraout_RDX & 1) == 0) {
              pIVar25 = ValidationState_t::FindDef(vstate,uVar14);
              ValidationState_t::diag
                        ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
              ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a12,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                         linkage_name._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"Entry point id \'",0x10);
              std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"\' uses more than one PushConstant interface.\n",0x2d
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"From Vulkan spec:\n",0x12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"There must be no more than one push constant block ",
                         0x33);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"statically used per shader entry point.",0x27);
              sVar20 = local_200;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                operator_delete(linkage_name._M_dataplus._M_p,
                                CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                         linkage_name.field_2._M_local_buf[0]) + 1);
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
              goto LAB_0061d047;
            }
          }
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&output_var_builtin,
                     (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
        }
        if (uVar55 != 0) goto LAB_0061c311;
        ValidationState_t::EntryPointReferences
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   &output_var_builtin,vstate,uVar14);
        if (output_var_builtin._M_h._M_rehash_policy._M_next_resize == 0) {
LAB_0061c2ff:
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&output_var_builtin,
                     (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
          goto LAB_0061c311;
        }
        bVar10 = anon_unknown_0::hasDecoration
                           ((anon_unknown_0 *)(ulong)uVar14,0x22,decoration_00,pVVar43);
        if (bVar10) {
          if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize == 0) ||
             (bVar10 = anon_unknown_0::hasDecoration
                                 ((anon_unknown_0 *)(ulong)uVar14,0x21,decoration_00,pVVar43),
             bVar10)) goto LAB_0061c2ff;
          pIVar25 = ValidationState_t::FindDef(vstate,uVar14);
          ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25)
          ;
          ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a15,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                     linkage_name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"UniformConstant id \'",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          lVar48 = 0x21;
          pcVar53 = "\' is missing Binding decoration.\n";
        }
        else {
          pIVar25 = ValidationState_t::FindDef(vstate,uVar14);
          ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25)
          ;
          ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a15,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                     linkage_name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"UniformConstant id \'",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          lVar48 = 0x27;
          pcVar53 = "\' is missing DescriptorSet decoration.\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,pcVar53,lVar48);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3d0,"From Vulkan spec:\n",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3d0,
                   "These variables must have DescriptorSet and Binding decorations specified",0x49)
        ;
        sVar20 = local_200;
LAB_0061d012:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
          operator_delete(linkage_name._M_dataplus._M_p,
                          CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                   linkage_name.field_2._M_local_buf[0]) + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
LAB_0061d047:
        local_5b0 = (Instruction *)(ulong)(uint)sVar20;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&output_var_builtin,(_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt
                  );
LAB_0061d323:
        _Var9._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
        cVar58 = '\x01';
      }
      else {
LAB_0061c311:
        bVar10 = spvIsOpenGLEnv(vstate->context_->target_env);
        local_558 = (pointer)CONCAT44(local_558._4_4_,uVar55);
        if (bVar10) {
          bVar59 = uVar55 == 0xc;
          bVar60 = uVar55 == 2;
          local_560 = pIVar51;
          bVar10 = anon_unknown_0::hasDecoration(this_01,2,decoration_00,pVVar43);
          uVar55 = (uint)local_558;
          bVar11 = anon_unknown_0::hasDecoration(this_01,3,decoration_00,pVVar43);
          if ((bVar59 && bVar10) || (pIVar51 = local_560, bVar60 && (bVar10 || bVar11))) {
            ValidationState_t::EntryPointReferences
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &output_var_builtin,vstate,uVar14);
            if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize != 0) &&
               (bVar10 = anon_unknown_0::hasDecoration(this_01,0x21,decoration_00,pVVar43), !bVar10)
               ) {
              pIVar25 = ValidationState_t::FindDef(vstate,uVar14);
              ValidationState_t::diag
                        ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
              pcVar53 = "Storage Buffer";
              if (uVar55 == 2) {
                pcVar53 = "Uniform";
              }
              linkage_name._M_dataplus._M_p = pcVar53;
              pDVar32 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)local_3d0,(char **)&linkage_name);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar32," id \'",5);
              std::ostream::_M_insert<unsigned_long>((ulong)pDVar32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar32,"\' is missing Binding decoration.\n",0x21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar32,"From ARB_gl_spirv extension:\n",0x1d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar32,"Uniform and shader storage block variables must ",0x30)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar32,"also be decorated with a *Binding*.",0x23);
              local_5b0 = (Instruction *)(ulong)(uint)pDVar32->error_;
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&output_var_builtin,
                         (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
              _Var9 = input_var_builtin._M_h._M_before_begin;
              cVar58 = '\x01';
              pIVar51 = local_560;
              goto joined_r0x0061d334;
            }
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&output_var_builtin,
                       (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
            pIVar51 = local_560;
          }
        }
        cVar58 = '\0';
        _Var9._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
        if ((int)uVar55 < 9) {
          bVar40 = 0;
          if (uVar55 == 2) goto LAB_0061c43b;
          if (uVar55 == 4) {
            bVar10 = EnumSet<spv::Capability>::contains
                               ((EnumSet<spv::Capability> *)local_4b8,
                                CapabilityWorkgroupMemoryExplicitLayoutKHR);
            bVar40 = 1;
            _Var9 = input_var_builtin._M_h._M_before_begin;
            if (bVar10) goto LAB_0061c43b;
          }
        }
        else {
          if ((uVar55 == 9) || (uVar55 == 0xc)) {
            bVar40 = 0;
          }
          else {
            bVar40 = 0;
            if (uVar55 != 0x14e5) goto joined_r0x0061d334;
          }
LAB_0061c43b:
          pIVar25 = ValidationState_t::FindDef
                              (vstate,(pIVar51->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1]);
          uVar4 = (pIVar25->inst_).opcode;
          if ((uVar4 != 0x20) && (uVar4 != 0x1141)) {
            __assert_fail("spv::Op::OpTypePointer == ptrInst->opcode() || spv::Op::OpTypeUntypedPointerKHR == ptrInst->opcode()"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp"
                          ,0x4c5,
                          "spv_result_t spvtools::val::(anonymous namespace)::CheckDecorationsOfBuffers(ValidationState_t &)"
                         );
          }
          if (uVar3 == 0x1142) {
            puVar46 = (pIVar51->words_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (0x10 < (ulong)((long)(pIVar51->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar46)) {
              pMVar29 = puVar46 + 4;
              goto LAB_0061c499;
            }
LAB_0061c509:
            MVar16 = kRowMajor;
          }
          else {
            pMVar29 = (pIVar25->words_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start + 3;
LAB_0061c499:
            MVar16 = *pMVar29;
            if (MVar16 == kRowMajor) goto LAB_0061c509;
            pIVar30 = ValidationState_t::FindDef(vstate,MVar16);
            if ((bVar40 == 0) && (((pIVar30->inst_).opcode & 0xfffe) == 0x1c)) {
              MVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar30,1);
              pIVar30 = ValidationState_t::FindDef(vstate,MVar16);
            }
            if ((pIVar30->inst_).opcode != 0x1e) {
              cVar58 = '\x03';
              _Var9._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
              goto joined_r0x0061d334;
            }
            local_3d0._0_4_ = kColumnMajor;
            local_3d0._4_4_ = 0;
            anon_unknown_0::ComputeMemberConstraintsForStruct
                      ((MemberConstraints *)&input_var_builtin,MVar16,(LayoutConstraints *)local_3d0
                       ,vstate);
          }
          pcVar53 = "ConstantDataStorageBuffer";
          if (bVar40 != 0) {
            pcVar53 = "Function or Workgroup";
          }
          _ep_id = (pointer)(pcVar53 + 0xc);
          if (uVar55 == 9) {
            _ep_id = (pointer)0x8d95bb;
          }
          pVVar43 = (ValidationState_t *)0x8d9720;
          if (uVar55 == 2) {
            _ep_id = (pointer)0x8d9720;
          }
          bVar10 = spvIsVulkanEnv(vstate->context_->target_env);
          if (bVar10) {
            bVar10 = anon_unknown_0::hasDecoration
                               ((anon_unknown_0 *)(ulong)MVar16,2,decoration_00,pVVar43);
            bVar11 = anon_unknown_0::hasDecoration
                               ((anon_unknown_0 *)(ulong)MVar16,3,decoration_00,pVVar43);
            if ((uVar55 == 0xc) && (bVar11)) {
              pIVar25 = ValidationState_t::FindDef(vstate,uVar14);
              ValidationState_t::diag
                        ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
              ValidationState_t::VkErrorID_abi_cxx11_
                        ((string *)&output_var_builtin,vstate,0x1a13,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                         output_var_builtin._M_h._M_bucket_count);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"Storage buffer id \'",0x13);
              std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,
                         " In Vulkan, BufferBlock is disallowed on variables in the StorageBuffer storage class"
                         ,0x55);
              local_5b0 = (Instruction *)(ulong)(uint)local_200;
              if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                  &output_var_builtin._M_h._M_before_begin) {
                operator_delete(output_var_builtin._M_h._M_buckets,
                                (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)->
                                               _M_nxt + 1));
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
              goto LAB_0061d323;
            }
            if (uVar55 == 9 && !bVar10) {
              pIVar25 = ValidationState_t::FindDef(vstate,MVar16);
              ValidationState_t::diag
                        ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
              ValidationState_t::VkErrorID_abi_cxx11_
                        ((string *)&output_var_builtin,vstate,0x1a13,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                         output_var_builtin._M_h._M_bucket_count);
              lVar48 = 0x11;
              pcVar53 = "PushConstant id \'";
LAB_0061ce4f:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,pcVar53,lVar48);
              std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"\' is missing Block decoration.\n",0x1f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"From Vulkan spec:\n",0x12);
              lVar48 = 0x39;
              pcVar53 = "Such variables must be identified with a Block decoration";
            }
            else {
              if (uVar55 == 0xc && !bVar10) {
                pIVar25 = ValidationState_t::FindDef(vstate,MVar16);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
                ValidationState_t::VkErrorID_abi_cxx11_
                          ((string *)&output_var_builtin,vstate,0x1a13,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                           output_var_builtin._M_h._M_bucket_count);
                lVar48 = 0x12;
                pcVar53 = "StorageBuffer id \'";
                goto LAB_0061ce4f;
              }
              pVVar43 = (ValidationState_t *)CONCAT71((int7)((ulong)pVVar43 >> 8),uVar55 != 2);
              if ((bVar10 || bVar11) || uVar55 != 2) {
                if ((uVar55 != 0xc) && (uVar55 != 2)) goto LAB_0061c71d;
                ValidationState_t::EntryPointReferences
                          ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&output_var_builtin,vstate,uVar14);
                if (output_var_builtin._M_h._M_rehash_policy._M_next_resize != 0) {
                  bVar10 = anon_unknown_0::hasDecoration(this_01,0x22,decoration_00,pVVar43);
                  if (bVar10) {
                    if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize == 0) ||
                       (bVar10 = anon_unknown_0::hasDecoration(this_01,0x21,decoration_00,pVVar43),
                       bVar10)) goto LAB_0061c70b;
                    pIVar25 = ValidationState_t::FindDef(vstate,uVar14);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
                    ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a15,(char *)0x0)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                               linkage_name._M_string_length);
                    pDVar32 = DiagnosticStream::operator<<
                                        ((DiagnosticStream *)local_3d0,(char **)&ep_id);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar32," id \'",5);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar32);
                    lVar48 = 0x21;
                    pcVar53 = "\' is missing Binding decoration.\n";
                  }
                  else {
                    pIVar25 = ValidationState_t::FindDef(vstate,uVar14);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
                    ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a15,(char *)0x0)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                               linkage_name._M_string_length);
                    pDVar32 = DiagnosticStream::operator<<
                                        ((DiagnosticStream *)local_3d0,(char **)&ep_id);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar32," id \'",5);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar32);
                    lVar48 = 0x27;
                    pcVar53 = "\' is missing DescriptorSet decoration.\n";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar32,pcVar53,lVar48);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar32,"From Vulkan spec:\n",0x12);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar32,
                             "These variables must have DescriptorSet and Binding decorations specified"
                             ,0x49);
                  sVar20 = pDVar32->error_;
                  goto LAB_0061d012;
                }
LAB_0061c70b:
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&output_var_builtin,
                           (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
                goto LAB_0061c71d;
              }
              pIVar25 = ValidationState_t::FindDef(vstate,MVar16);
              ValidationState_t::diag
                        ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
              ValidationState_t::VkErrorID_abi_cxx11_
                        ((string *)&output_var_builtin,vstate,0x1a14,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                         output_var_builtin._M_h._M_bucket_count);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"Uniform id \'",0xc);
              std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"\' is missing Block or BufferBlock decoration.\n",
                         0x2e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"From Vulkan spec:\n",0x12);
              lVar48 = 0x48;
              pcVar53 = "Such variables must be identified with a Block or BufferBlock decoration";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,pcVar53,lVar48);
            local_5b0 = (Instruction *)(ulong)(uint)local_200;
            if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                &output_var_builtin._M_h._M_before_begin) {
              operator_delete(output_var_builtin._M_h._M_buckets,
                              (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)->
                                             _M_nxt + 1));
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
            goto LAB_0061d323;
          }
LAB_0061c71d:
          local_560 = pIVar51;
          if (MVar16 != kRowMajor) {
            local_3d0._0_4_ = MVar16;
            pmVar37 = std::
                      map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                      ::operator[](local_4c8,(key_type_conflict *)local_3d0);
            p_Var31 = (__hashtable *)(pmVar37->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
            ;
            local_408 = (__hashtable *)&(pmVar37->_M_t)._M_impl.super__Rb_tree_header;
            if (p_Var31 != local_408) {
              local_420 = (ulong)bVar40 | 0x28;
              local_550 = CONCAT71(local_550._1_7_,uVar55 != 0xc && uVar55 != 0x14e5);
              do {
                bVar10 = uVar55 == 2;
                fVar6 = (p_Var31->_M_rehash_policy)._M_max_load_factor;
                bVar11 = fVar6 == 2.8026e-45;
                if ((uVar55 == 2) && (bVar59 = true, fVar6 == 4.2039e-45)) {
LAB_0061c830:
                  output_var_builtin._M_h._M_buckets =
                       (__buckets_ptr)
                       CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,(pIVar25->inst_).result_id)
                  ;
                  local_3d0 = (undefined1  [8])__h_2;
                  std::
                  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                            (__h_2,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&output_var_builtin,local_3d0);
                  output_var_builtin._M_h._M_buckets =
                       (__buckets_ptr)CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,MVar16);
                  local_3d0 = (undefined1  [8])__h_3;
                  uVar55 = (uint)local_558;
                  std::
                  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                            (__h_3,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&output_var_builtin,local_3d0);
                }
                else {
                  bVar59 = bVar11;
                  if ((bVar40 == 0) && (((uVar55 != 9 && (uVar55 != 0x14e5)) && (uVar55 != 0xc)))) {
                    bVar59 = false;
                  }
                  if (bVar10 && bVar11) {
                    output_var_builtin._M_h._M_buckets =
                         (__buckets_ptr)
                         CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,
                                  (pIVar25->inst_).result_id);
                    local_3d0 = (undefined1  [8])__h;
                    std::
                    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                              (__h,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&output_var_builtin,local_3d0);
                    output_var_builtin._M_h._M_buckets =
                         (__buckets_ptr)CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,MVar16);
                    uVar55 = (uint)local_558;
                    local_3d0 = (undefined1  [8])&vstate->struct_for_uniform_block_;
                    std::
                    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                              (&vstate->struct_for_uniform_block_,
                               (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                *)&output_var_builtin,local_3d0);
                  }
                  if (fVar6 == 2.8026e-45 && (char)local_550 == '\0') goto LAB_0061c830;
                }
                if (!(bool)((bVar10 && bVar11) | bVar59)) goto LAB_0061cab0;
                pcVar53 = "BufferBlock";
                if (fVar6 == 2.8026e-45) {
                  pcVar53 = "Block";
                }
                local_544 = CONCAT31(local_544._1_3_,
                                     *(undefined1 *)
                                      ((long)&(vstate->options_->universal_limits_).
                                              max_struct_members + local_420));
                output_var_builtin._M_h._M_buckets = (__buckets_ptr)pcVar53;
                bVar60 = anon_unknown_0::isMissingOffsetInStruct(MVar16,vstate);
                if (bVar60) {
                  pIVar25 = ValidationState_t::FindDef(vstate,MVar16);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,"Structure id ",0xd);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0," decorated as ",0xe);
                  pDVar32 = DiagnosticStream::operator<<
                                      ((DiagnosticStream *)local_3d0,(char **)&output_var_builtin);
                  lVar48 = 0x35;
                  pcVar53 = " must be explicitly laid out with Offset decorations.";
LAB_0061d301:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar32,pcVar53,lVar48);
                  sVar20 = pDVar32->error_;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
LAB_0061d319:
                  local_5b0 = (Instruction *)(ulong)(uint)sVar20;
                  pIVar51 = local_560;
                  goto LAB_0061d323;
                }
                k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
                _M_head_impl = (_Head_base<1UL,_unsigned_int,_false>)0x0;
                k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                     DecorationRelaxedPrecision;
                auStack_4f0._0_8_ = (pointer)0x0;
                local_4e0 = std::
                            _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp:1343:23)>
                            ::_M_invoke;
                auStack_4f0._8_8_ =
                     std::
                     _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp:1343:23)>
                     ::_M_manager;
                bVar60 = anon_unknown_0::checkForRequiredDecoration
                                   (MVar16,(function<bool_(spv::Decoration)> *)&k,OpTypeArray,vstate
                                   );
                if ((code *)auStack_4f0._8_8_ != (code *)0x0) {
                  (*(code *)auStack_4f0._8_8_)
                            ((function<bool_(spv::Decoration)> *)&k,
                             (function<bool_(spv::Decoration)> *)&k,3);
                }
                if (!bVar60) {
                  pIVar25 = ValidationState_t::FindDef(vstate,MVar16);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,"Structure id ",0xd);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0," decorated as ",0xe);
                  pDVar32 = DiagnosticStream::operator<<
                                      ((DiagnosticStream *)local_3d0,(char **)&output_var_builtin);
                  lVar48 = 0x3a;
                  pcVar53 = " must be explicitly laid out with ArrayStride decorations.";
                  goto LAB_0061d301;
                }
                _builtin = (void *)0x0;
                vStack_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                vStack_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)std::
                              _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp:1355:23)>
                              ::_M_invoke;
                vStack_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)std::
                              _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp:1355:23)>
                              ::_M_manager;
                bVar60 = anon_unknown_0::checkForRequiredDecoration
                                   (MVar16,(function<bool_(spv::Decoration)> *)&builtin,OpTypeMatrix
                                    ,vstate);
                if ((code *)vStack_470.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish != (code *)0x0) {
                  (*(code *)vStack_470.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish)
                            ((_Any_data *)&builtin,(_Any_data *)&builtin,__destroy_functor);
                }
                if (!bVar60) {
                  pIVar25 = ValidationState_t::FindDef(vstate,MVar16);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,"Structure id ",0xd);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0," decorated as ",0xe);
                  pDVar32 = DiagnosticStream::operator<<
                                      ((DiagnosticStream *)local_3d0,(char **)&output_var_builtin);
                  lVar48 = 0x3b;
                  pcVar53 = " must be explicitly laid out with MatrixStride decorations.";
                  goto LAB_0061d301;
                }
                local_3f8._M_unused._M_object = (void *)0x0;
                local_3f8._8_8_ = 0;
                local_3e0 = std::
                            _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp:1367:23)>
                            ::_M_invoke;
                local_3e8 = std::
                            _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_decorations.cpp:1367:23)>
                            ::_M_manager;
                bVar60 = anon_unknown_0::checkForRequiredDecoration
                                   (MVar16,(function<bool_(spv::Decoration)> *)&local_3f8,
                                    OpTypeMatrix,vstate);
                if (local_3e8 != (code *)0x0) {
                  (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
                }
                if (!bVar60) {
                  pIVar25 = ValidationState_t::FindDef(vstate,MVar16);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,"Structure id ",0xd);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0," decorated as ",0xe);
                  pDVar32 = DiagnosticStream::operator<<
                                      ((DiagnosticStream *)local_3d0,(char **)&output_var_builtin);
                  lVar48 = 0x43;
                  pcVar53 = " must be explicitly laid out with RowMajor or ColMajor decorations.";
                  goto LAB_0061d301;
                }
                bVar60 = spvIsVulkanEnv(vstate->context_->target_env);
                uVar55 = (uint)local_558;
                if (!bVar60) goto LAB_0061cab0;
                if (bVar10 && bVar11) {
                  sVar20 = anon_unknown_0::checkLayout
                                     (MVar16,(char *)_ep_id,
                                      (char *)output_var_builtin._M_h._M_buckets,true,
                                      local_544._0_1_,0,(MemberConstraints *)&input_var_builtin,
                                      vstate);
                  if (sVar20 == SPV_SUCCESS) goto LAB_0061ca74;
                  goto LAB_0061d319;
                }
LAB_0061ca74:
                if (bVar59) {
                  sVar20 = anon_unknown_0::checkLayout
                                     (MVar16,(char *)_ep_id,
                                      (char *)output_var_builtin._M_h._M_buckets,false,
                                      local_544._0_1_,0,(MemberConstraints *)&input_var_builtin,
                                      vstate);
                  if (sVar20 != SPV_SUCCESS) goto LAB_0061d319;
                }
LAB_0061cab0:
                p_Var31 = (__hashtable *)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var31);
              } while (p_Var31 != local_408);
            }
          }
          _Var9._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
          cVar58 = '\0';
          pIVar51 = local_560;
        }
      }
joined_r0x0061d334:
      while (_Var9._M_nxt != (_Hash_node_base *)0x0) {
        p_Var52 = (_Var9._M_nxt)->_M_nxt;
        operator_delete(_Var9._M_nxt,0x20);
        _Var9._M_nxt = p_Var52;
      }
      memset(input_var_builtin._M_h._M_buckets,0,input_var_builtin._M_h._M_bucket_count << 3);
      input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      input_var_builtin._M_h._M_element_count = 0;
      if (&input_var_builtin._M_h._M_single_bucket != input_var_builtin._M_h._M_buckets) {
        operator_delete(input_var_builtin._M_h._M_buckets,
                        input_var_builtin._M_h._M_bucket_count << 3);
      }
      if ((cVar58 != '\x03') && (cVar58 != '\0')) {
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&seen_vars);
        if ((spv_result_t)local_5b0 != SPV_SUCCESS) {
          return (spv_result_t)local_5b0;
        }
        goto LAB_0061d6d5;
      }
      pIVar51 = pIVar51 + 1;
    } while (pIVar51 != pIVar49);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&seen_vars);
LAB_0061d6d5:
  seen_vars._M_h._M_element_count = (size_type)&seen_vars._M_h._M_bucket_count;
  sVar20 = SPV_SUCCESS;
  seen_vars._M_h._M_bucket_count = seen_vars._M_h._M_bucket_count & 0xffffffff00000000;
  seen_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen_vars._M_h._M_rehash_policy._M_next_resize = 0;
  input_var_builtin._M_h._M_element_count = (size_type)&input_var_builtin._M_h._M_bucket_count;
  input_var_builtin._M_h._M_bucket_count =
       input_var_builtin._M_h._M_bucket_count & 0xffffffff00000000;
  input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  input_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
  pIVar51 = (vstate->ordered_instructions_).
            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar49 = (vstate->ordered_instructions_).
            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_558 = pIVar49;
  input_var_builtin._M_h._M_rehash_policy._0_8_ = input_var_builtin._M_h._M_element_count;
  seen_vars._M_h._M_rehash_policy._0_8_ = seen_vars._M_h._M_element_count;
  if (pIVar51 != pIVar49) {
    do {
      uVar3 = (pIVar51->inst_).opcode;
      if (uVar3 == 0x48) {
        puVar46 = (pIVar51->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        id_00._M_head_impl = puVar46[1];
        _Var7._M_head_impl = ((_Head_base<1UL,_unsigned_int,_false> *)(puVar46 + 2))->_M_head_impl;
        uVar17 = puVar46[3];
        k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
        super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl = id_00._M_head_impl;
        k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.super__Tuple_impl<1UL,_unsigned_int>
        .super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
             (_Head_base<1UL,_unsigned_int,_false>)
             (_Head_base<1UL,_unsigned_int,_false>)_Var7._M_head_impl;
        auStack_4f0._0_4_ = uVar17;
        pVar64 = std::
                 _Rb_tree<std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>>
                 ::_M_insert_unique<std::tuple<spv::Decoration,unsigned_int,unsigned_int>const&>
                           ((_Rb_tree<std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>>
                             *)&input_var_builtin,
                            (tuple<spv::Decoration,_unsigned_int,_unsigned_int> *)&k);
        if ((((undefined1  [16])pVar64 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (uVar17 != 0x1603)) {
          pIVar25 = ValidationState_t::FindDef(vstate,id_00._M_head_impl);
          ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,"ID \'",4);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"\', member \'",0xb);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"\' decorated with ",0x11);
          ValidationState_t::SpvDecorationString_abi_cxx11_
                    ((string *)&output_var_builtin,vstate,uVar17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                     output_var_builtin._M_h._M_bucket_count);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0," multiple times is not allowed.",0x1f);
          sVar20 = local_200;
        }
        else {
          if (uVar17 == 4) {
            uVar15 = 5;
          }
          else {
            if (uVar17 != 5) goto LAB_0061d896;
            uVar15 = 4;
          }
          _Stack_474._M_head_impl = id_00._M_head_impl;
          builtin = _Var7._M_head_impl;
          vStack_470.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(vStack_470.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,uVar15);
          iVar34 = std::
                   _Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                   ::find((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                           *)&input_var_builtin,(key_type *)&builtin);
          if (iVar34._M_node == (_Base_ptr)&input_var_builtin._M_h._M_bucket_count)
          goto LAB_0061d896;
          pIVar25 = ValidationState_t::FindDef(vstate,id_00._M_head_impl);
          ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,"ID \'",4);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"\', member \'",0xb);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"\' decorated with both ",0x16);
          ValidationState_t::SpvDecorationString_abi_cxx11_
                    ((string *)&output_var_builtin,vstate,uVar17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                     output_var_builtin._M_h._M_bucket_count);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0," and ",5);
LAB_0061d951:
          ValidationState_t::SpvDecorationString_abi_cxx11_(&linkage_name,vstate,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                     linkage_name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0," is not allowed.",0x10);
          sVar20 = local_200;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
            operator_delete(linkage_name._M_dataplus._M_p,
                            CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                     linkage_name.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((__node_base *)output_var_builtin._M_h._M_buckets !=
            &output_var_builtin._M_h._M_before_begin) {
          operator_delete(output_var_builtin._M_h._M_buckets,
                          (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)->_M_nxt +
                                 1));
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
        goto LAB_0061d9cc;
      }
      if (uVar3 == 0x47) {
        puVar46 = (pIVar51->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        p_Var1 = (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int> *)(puVar46 + 1);
        uVar17 = (p_Var1->super__Tuple_impl<1UL,_unsigned_int>).
                 super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
        decoration = puVar46[2];
        k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> = *p_Var1;
        pVar63 = std::
                 _Rb_tree<std::tuple<spv::Decoration,unsigned_int>,std::tuple<spv::Decoration,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int>>>
                 ::_M_insert_unique<std::tuple<spv::Decoration,unsigned_int>const&>
                           ((_Rb_tree<std::tuple<spv::Decoration,unsigned_int>,std::tuple<spv::Decoration,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int>>>
                             *)&seen_vars,&k);
        if (((((undefined1  [16])pVar63 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (decoration != 0x26)) && (decoration != 0x1603)) {
          pIVar25 = ValidationState_t::FindDef(vstate,uVar17);
          ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,"ID \'",4);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"\' decorated with ",0x11);
          ValidationState_t::SpvDecorationString_abi_cxx11_
                    ((string *)&output_var_builtin,vstate,decoration);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                     output_var_builtin._M_h._M_bucket_count);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0," multiple times is not allowed.",0x1f);
          sVar20 = local_200;
          if ((__node_base *)output_var_builtin._M_h._M_buckets !=
              &output_var_builtin._M_h._M_before_begin) {
            operator_delete(output_var_builtin._M_h._M_buckets,
                            (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)->_M_nxt
                                   + 1));
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
          goto LAB_0061d9cc;
        }
        lVar48 = 0;
        do {
          uVar15 = (&DAT_008ecce4)[lVar48 * 2];
          if (((&(anonymous_namespace)::
                 CheckDecorationsCompatibility(spvtools::val::ValidationState_t&)::
                 mutually_exclusive_per_id)[lVar48 * 2] == decoration) ||
             (bVar10 = uVar15 == decoration,
             uVar15 = (&(anonymous_namespace)::
                        CheckDecorationsCompatibility(spvtools::val::ValidationState_t&)::
                        mutually_exclusive_per_id)[lVar48 * 2], bVar10)) {
            _Stack_474._M_head_impl = uVar15;
            builtin = uVar17;
            iVar33 = std::
                     _Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                     ::find((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                             *)&seen_vars,(key_type *)&builtin);
            if (iVar33._M_node != (_Base_ptr)&seen_vars._M_h._M_bucket_count) {
              pIVar25 = ValidationState_t::FindDef(vstate,uVar17);
              ValidationState_t::diag
                        ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,"ID \'",4);
              std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"\' decorated with both ",0x16);
              ValidationState_t::SpvDecorationString_abi_cxx11_
                        ((string *)&output_var_builtin,vstate,decoration);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                         output_var_builtin._M_h._M_bucket_count);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0," and ",5);
              goto LAB_0061d951;
            }
          }
          lVar48 = lVar48 + 1;
          pIVar49 = local_558;
        } while (lVar48 != 3);
      }
LAB_0061d896:
      pIVar51 = pIVar51 + 1;
    } while (pIVar51 != pIVar49);
    sVar20 = SPV_SUCCESS;
  }
LAB_0061d9cc:
  std::
  _Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
  ::_M_erase((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
              *)&input_var_builtin,(_Link_type)input_var_builtin._M_h._M_before_begin._M_nxt);
  std::
  _Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
  ::_M_erase((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
              *)&seen_vars,(_Link_type)seen_vars._M_h._M_before_begin._M_nxt);
  if (sVar20 == SPV_SUCCESS) {
    pvVar35 = ValidationState_t::functions(vstate);
    pFVar8 = (pvVar35->
             super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (this_02 = (pvVar35->
                   super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                   )._M_impl.super__Vector_impl_data._M_start; this_02 != pFVar8;
        this_02 = this_02 + 1) {
      sVar36 = Function::block_count(this_02);
      bVar10 = anon_unknown_0::hasImportLinkageAttribute(this_02->id_,vstate);
      if (sVar36 == 0) {
        if (!bVar10) {
          pIVar25 = ValidationState_t::FindDef(vstate,this_02->id_);
          ValidationState_t::diag
                    ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,pIVar25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"Function declaration (id ",0x19);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          pcVar53 = ") must have a LinkageAttributes decoration with the Import Linkage type.";
          lVar48 = 0x48;
          goto LAB_0061db02;
        }
      }
      else if (bVar10) {
        pIVar25 = ValidationState_t::FindDef(vstate,this_02->id_);
        ValidationState_t::diag
                  ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,pIVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3d0,"Function definition (id ",0x18);
        std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
        pcVar53 = ") may not be decorated with Import Linkage type.";
        lVar48 = 0x30;
LAB_0061db02:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,pcVar53,lVar48);
        sVar20 = local_200;
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
        if (sVar20 != SPV_SUCCESS) {
          return sVar20;
        }
        break;
      }
    }
    MVar19 = ValidationState_t::memory_model(vstate);
    if (MVar19 == MemoryModelVulkan) {
      input_var_builtin._M_h._M_buckets = &input_var_builtin._M_h._M_before_begin._M_nxt;
      input_var_builtin._M_h._M_bucket_count = 0;
      input_var_builtin._M_h._M_before_begin._M_nxt =
           input_var_builtin._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)&seen_vars,(string *)&input_var_builtin,_S_out);
      p_Var52 = (vstate->all_definitions_)._M_h._M_before_begin._M_nxt;
      sVar20 = SPV_SUCCESS;
      if (p_Var52 != (_Hash_node_base *)0x0) {
        do {
          pIVar25 = (Instruction *)p_Var52[2]._M_nxt;
          MVar16 = (pIVar25->inst_).result_id;
          local_3d0._0_4_ = MVar16;
          pmVar37 = std::
                    map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                    ::operator[](&vstate->id_decorations_,(key_type_conflict *)local_3d0);
          for (p_Var38 = (pmVar37->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var38 != &(pmVar37->_M_t)._M_impl.super__Rb_tree_header;
              p_Var38 = (_Base_ptr)std::_Rb_tree_increment(p_Var38)) {
            if ((p_Var38[1]._M_color | 2) == 0x17) {
              _Var5 = p_Var38[2]._M_color;
              pcVar53 = "Volatile";
              if (p_Var38[1]._M_color == 0x17) {
                pcVar53 = "Coherent";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&seen_vars,pcVar53,8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&seen_vars," decoration targeting ",0x16);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_3d0,vstate,MVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&seen_vars,(char *)local_3d0,local_3c8._0_8_);
              if (local_3d0 != (undefined1  [8])((long)local_3c8 + 8)) {
                operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
              }
              if (_Var5 != ~_S_red) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&seen_vars," (member index ",0xf);
                poVar39 = (ostream *)std::ostream::operator<<((ostream *)&seen_vars,_Var5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar39,")",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&seen_vars," is banned when using the Vulkan memory model.",0x2e
                        );
              ValidationState_t::diag
                        ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar25);
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                         output_var_builtin._M_h._M_bucket_count);
              if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                  &output_var_builtin._M_h._M_before_begin) {
                operator_delete(output_var_builtin._M_h._M_buckets,
                                (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)->
                                               _M_nxt + 1));
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
              sVar20 = local_200;
              goto LAB_0061dd4a;
            }
          }
          p_Var52 = p_Var52->_M_nxt;
        } while (p_Var52 != (_Hash_node_base *)0x0);
      }
LAB_0061dd4a:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&seen_vars);
      std::ios_base::~ios_base(local_138);
      if ((__node_base *)input_var_builtin._M_h._M_buckets !=
          &input_var_builtin._M_h._M_before_begin) {
        operator_delete(input_var_builtin._M_h._M_buckets,
                        (ulong)((long)&(input_var_builtin._M_h._M_before_begin._M_nxt)->_M_nxt + 1))
        ;
      }
      if (sVar20 != SPV_SUCCESS) {
        return sVar20;
      }
    }
    sVar20 = anon_unknown_0::CheckDecorationsFromDecoration(vstate);
  }
  return sVar20;
}

Assistant:

spv_result_t ValidateDecorations(ValidationState_t& vstate) {
  if (auto error = CheckImportedVariableInitialization(vstate)) return error;
  if (auto error = CheckDecorationsOfEntryPoints(vstate)) return error;
  if (auto error = CheckDecorationsOfBuffers(vstate)) return error;
  if (auto error = CheckDecorationsCompatibility(vstate)) return error;
  if (auto error = CheckLinkageAttrOfFunctions(vstate)) return error;
  if (auto error = CheckVulkanMemoryModelDeprecatedDecorations(vstate))
    return error;
  if (auto error = CheckDecorationsFromDecoration(vstate)) return error;
  return SPV_SUCCESS;
}